

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider_p.h
# Opt level: O0

void __thiscall QMimeProviderBase::~QMimeProviderBase(QMimeProviderBase *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QMimeProviderBase_00beeff8;
  QString::~QString((QString *)0x902134);
  return;
}

Assistant:

virtual ~QMimeProviderBase() = default;